

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase309::run(TestCase309 *this)

{
  Reader reader_00;
  Builder builder_00;
  SegmentBuilder *pSVar1;
  SegmentBuilder *pSVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t extraout_RDX;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ArrayPtr<const_unsigned_char> packedBytes_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  ReaderOptions options;
  TestPipe pipe;
  PackedMessageReader reader;
  TestMessageBuilder builder;
  undefined1 local_310 [8];
  OutputStream OStack_308;
  WirePointer *local_300;
  _Alloc_hider local_2f8;
  uchar *local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  size_type local_2d8;
  Reader local_2d0;
  StructBuilder local_2b0;
  PointerReader local_288;
  StructReader local_268;
  InputStream local_238;
  size_t in_stack_fffffffffffffde0;
  bool in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffde9 [15];
  TestMessageBuilder local_100;
  size_t extraout_RDX_00;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_100.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_0036cfc0;
  local_100.desiredSegmentCount = 7;
  MessageBuilder::getRootInternal((Builder *)local_310,(MessageBuilder *)&local_100);
  local_238._vptr_InputStream = (_func_int **)local_310;
  PointerBuilder::initStruct(&local_2b0,(PointerBuilder *)&local_238,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)local_300;
  builder_00._builder.segment = (SegmentBuilder *)OStack_308._vptr_OutputStream;
  builder_00._builder.data = (void *)in_stack_fffffffffffffde0;
  builder_00._builder.pointers._0_1_ = in_stack_fffffffffffffde8;
  builder_00._builder._25_15_ = in_stack_fffffffffffffde9;
  initTestMessage(builder_00);
  paVar3 = &local_2e8;
  local_310 = (undefined1  [8])&PTR__TestPipe_0036cee8;
  OStack_308._vptr_OutputStream = (_func_int **)&PTR__TestPipe_0036cf28;
  local_300 = (WirePointer *)0x1;
  local_2f0 = (uchar *)0x0;
  local_2e8._M_local_buf[0] = '\0';
  local_2d8 = 0;
  local_2f8._M_p = (pointer)paVar3;
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
  AVar5.ptr = (ArrayPtr<const_capnp::word> *)AVar4.size_;
  AVar5.size_ = (size_t)paVar3;
  writePackedMessage((capnp *)&OStack_308,(OutputStream *)AVar4.ptr,AVar5);
  AVar5 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
  AVar4.size_ = (ArrayPtr<const_capnp::word> *)AVar5.size_;
  AVar4.ptr = AVar4.size_;
  pSVar1 = (SegmentBuilder *)computeSerializedSizeInWords((capnp *)AVar5.ptr,AVar4);
  packedBytes.size_ = extraout_RDX;
  packedBytes.ptr = local_2f0;
  pSVar2 = (SegmentBuilder *)computeUnpackedSizeInWords((capnp *)local_2f8._M_p,packedBytes);
  local_238._vptr_InputStream = (_func_int **)pSVar1;
  if ((pSVar1 != pSVar2) && (kj::_::Debug::minSeverity < 3)) {
    AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
    segments.size_ = (ArrayPtr<const_capnp::word> *)AVar4.size_;
    segments.ptr = segments.size_;
    local_288.segment = (SegmentReader *)computeSerializedSizeInWords((capnp *)AVar4.ptr,segments);
    packedBytes_00.size_ = extraout_RDX_00;
    packedBytes_00.ptr = local_2f0;
    local_2d0.reader.segment =
         (SegmentReader *)computeUnpackedSizeInWords((capnp *)local_2f8._M_p,packedBytes_00);
    kj::_::Debug::
    log<char_const(&)[106],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,0x13c,ERROR,
               "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", _kjCondition, computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
               ,(char (*) [106])
                "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
               ,(DebugComparison<unsigned_long,_unsigned_long> *)&local_238,
               (unsigned_long *)&local_288,(unsigned_long *)&local_2d0);
  }
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  PackedMessageReader::PackedMessageReader
            ((PackedMessageReader *)&local_238,(BufferedInputStream *)local_310,options,
             (ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRootInternal(&local_2d0,(MessageReader *)&stack0xfffffffffffffdd8);
  local_288.pointer = local_2d0.reader.pointer;
  local_288.nestingLimit = local_2d0.reader.nestingLimit;
  local_288._28_4_ = local_2d0.reader._28_4_;
  local_288.segment = local_2d0.reader.segment;
  local_288.capTable = local_2d0.reader.capTable;
  PointerReader::getStruct(&local_268,&local_288,(word *)0x0);
  reader_00._reader.capTable = local_268.capTable;
  reader_00._reader.segment = local_268.segment;
  reader_00._reader.data = local_268.data;
  reader_00._reader.pointers = local_268.pointers;
  reader_00._reader.dataSize = local_268.dataSize;
  reader_00._reader.pointerCount = local_268.pointerCount;
  reader_00._reader._38_2_ = local_268._38_2_;
  reader_00._reader.nestingLimit = local_268.nestingLimit;
  reader_00._reader._44_4_ = local_268._44_4_;
  checkTestMessage(reader_00);
  PackedMessageReader::~PackedMessageReader((PackedMessageReader *)&local_238);
  TestPipe::~TestPipe((TestPipe *)local_310);
  TestMessageBuilder::~TestMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Packed, RoundTripOddSegmentCountLazy) {
  TestMessageBuilder builder(7);
  initTestMessage(builder.initRoot<TestAllTypes>());

  TestPipe pipe(1);
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  PackedMessageReader reader(pipe);
  checkTestMessage(reader.getRoot<TestAllTypes>());
}